

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_blas2.c
# Opt level: O2

int sp_ctrsv(char *uplo,char *trans,char *diag,SuperMatrix *L,SuperMatrix *U,singlecomplex *x,
            SuperLUStat_t *stat,int *info)

{
  char cVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  float *pfVar11;
  singlecomplex *psVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  SuperMatrix *pSVar16;
  SuperMatrix *pSVar17;
  singlecomplex *psVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  float fVar22;
  singlecomplex sVar23;
  singlecomplex sVar24;
  float fVar26;
  singlecomplex sVar25;
  singlecomplex sVar27;
  float fVar30;
  singlecomplex sVar28;
  singlecomplex sVar29;
  singlecomplex sVar31;
  singlecomplex sVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  int nsupc;
  int nsupr;
  SuperMatrix *local_180;
  SuperMatrix *local_178;
  singlecomplex *local_170;
  int incx;
  singlecomplex *local_160;
  undefined8 local_158;
  float fStack_150;
  float fStack_14c;
  long local_140;
  singlecomplex temp;
  
  incx = 1;
  *info = 0;
  if ((*uplo == 'U') || (*uplo == 'L')) {
    fVar35 = 2.8026e-45;
    iVar19 = -2;
    if (((byte)*trans - 0x43 < 0x12) && ((0x20801U >> ((byte)*trans - 0x43 & 0x1f) & 1) != 0)) {
      if ((*diag == 'U') || (*diag == 'N')) {
        iVar2 = L->nrow;
        fVar35 = 5.60519e-45;
        iVar19 = -4;
        if ((-1 < (long)iVar2) && (iVar2 == L->ncol)) {
          fVar35 = 7.00649e-45;
          iVar19 = -5;
          if ((-1 < U->nrow) && (U->nrow == U->ncol)) {
            pvVar4 = L->Store;
            lVar5 = *(long *)((long)pvVar4 + 8);
            pvVar6 = U->Store;
            lVar7 = *(long *)((long)pvVar6 + 8);
            local_180 = U;
            local_178 = L;
            local_170 = (singlecomplex *)trans;
            local_160 = singlecomplexCalloc((long)iVar2);
            if (local_160 == (singlecomplex *)0x0) {
              sprintf((char *)&temp,"%s at line %d in file %s\n",
                      "Malloc fails for work in sp_ctrsv().",0x81,
                      "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/csp_blas2.c"
                     );
              superlu_abort_and_exit((char *)&temp);
            }
            cVar1 = *uplo;
            if (*(char *)&local_170->r == 'T') {
              if (cVar1 == 'L') {
                if (local_178->nrow == 0) {
                  return 0;
                }
                fVar35 = 0.0;
                uVar21 = *(uint *)((long)pvVar4 + 4);
                while (psVar18 = local_160, -1 < (int)uVar21) {
                  lVar7 = *(long *)((long)pvVar4 + 0x30);
                  local_178 = (SuperMatrix *)CONCAT44(local_178._4_4_,uVar21);
                  uVar10 = (ulong)uVar21;
                  iVar19 = *(int *)(lVar7 + uVar10 * 4);
                  lVar13 = (long)iVar19;
                  iVar2 = *(int *)(*(long *)((long)pvVar4 + 0x20) + lVar13 * 4);
                  nsupr = *(int *)(*(long *)((long)pvVar4 + 0x20) + 4 + lVar13 * 4) - iVar2;
                  nsupc = *(int *)(lVar7 + 4 + uVar10 * 4) - iVar19;
                  lVar8 = *(long *)((long)pvVar4 + 0x10);
                  iVar19 = *(int *)(lVar8 + lVar13 * 4);
                  local_170 = (singlecomplex *)(long)iVar19;
                  iVar3 = *(int *)(lVar7 + 4 + uVar10 * 4);
                  lVar7 = lVar13;
                  while (lVar9 = lVar7, lVar9 < iVar3) {
                    iVar15 = iVar19 + nsupc;
                    iVar19 = *(int *)(lVar8 + 4 + lVar9 * 4);
                    lVar20 = (long)(iVar2 + nsupc);
                    for (lVar14 = (long)iVar15; lVar7 = lVar9 + 1, lVar14 < iVar19;
                        lVar14 = lVar14 + 1) {
                      fVar26 = x[*(int *)(*(long *)((long)pvVar4 + 0x18) + lVar20 * 4)].r;
                      fVar30 = x[*(int *)(*(long *)((long)pvVar4 + 0x18) + lVar20 * 4)].i;
                      fVar33 = *(float *)(lVar5 + lVar14 * 8);
                      fVar34 = *(float *)(lVar5 + 4 + lVar14 * 8);
                      sVar27.r = x[lVar9].r - (fVar33 * fVar26 + -fVar30 * fVar34);
                      sVar27.i = x[lVar9].i - (fVar33 * fVar30 + fVar26 * fVar34);
                      x[lVar9] = sVar27;
                      lVar20 = lVar20 + 1;
                    }
                  }
                  fVar35 = fVar35 + (float)((nsupr - nsupc) * nsupc * 8);
                  if (1 < nsupc) {
                    local_180 = (SuperMatrix *)
                                CONCAT44(local_180._4_4_,fVar35 + (float)((nsupc + -1) * nsupc * 4))
                    ;
                    ctrsv_("L","T","U",&nsupc,(singlecomplex *)(lVar5 + (long)local_170 * 8),&nsupr,
                           x + lVar13,&incx);
                    fVar35 = local_180._0_4_;
                  }
                  uVar21 = (int)local_178 - 1;
                }
              }
              else {
                if (local_180->nrow == 0) {
                  return 0;
                }
                lVar8 = 0;
                fVar35 = 0.0;
                while (psVar18 = local_160, lVar8 <= *(int *)((long)pvVar4 + 4)) {
                  lVar13 = *(long *)((long)pvVar4 + 0x30);
                  iVar19 = *(int *)(lVar13 + lVar8 * 4);
                  lVar9 = (long)iVar19;
                  nsupr = *(int *)(*(long *)((long)pvVar4 + 0x20) + 4 + lVar9 * 4) -
                          *(int *)(*(long *)((long)pvVar4 + 0x20) + lVar9 * 4);
                  nsupc = *(int *)(lVar13 + 4 + lVar8 * 4) - iVar19;
                  iVar19 = *(int *)(*(long *)((long)pvVar4 + 0x10) + lVar9 * 4);
                  iVar2 = *(int *)(lVar13 + 4 + lVar8 * 4);
                  lVar13 = lVar9;
                  while (lVar13 < iVar2) {
                    iVar3 = *(int *)(*(long *)((long)pvVar6 + 0x18) + 4 + lVar13 * 4);
                    iVar15 = *(int *)(*(long *)((long)pvVar6 + 0x18) + lVar13 * 4);
                    for (lVar20 = (long)iVar15; lVar20 < iVar3; lVar20 = lVar20 + 1) {
                      fVar26 = x[*(int *)(*(long *)((long)pvVar6 + 0x10) + lVar20 * 4)].r;
                      fVar30 = x[*(int *)(*(long *)((long)pvVar6 + 0x10) + lVar20 * 4)].i;
                      fVar33 = *(float *)(lVar7 + lVar20 * 8);
                      fVar34 = *(float *)(lVar7 + 4 + lVar20 * 8);
                      sVar29.r = x[lVar13].r - (fVar33 * fVar26 + -fVar30 * fVar34);
                      sVar29.i = x[lVar13].i - (fVar33 * fVar30 + fVar26 * fVar34);
                      x[lVar13] = sVar29;
                    }
                    fVar35 = fVar35 + (float)((iVar3 - iVar15) * 8);
                    lVar13 = lVar13 + 1;
                  }
                  local_180 = (SuperMatrix *)
                              CONCAT44(local_180._4_4_,fVar35 + (float)((nsupc * 4 + 0xe) * nsupc));
                  psVar18 = x + lVar9;
                  psVar12 = (singlecomplex *)((long)iVar19 * 8 + lVar5);
                  if (nsupc == 1) {
                    c_div(psVar18,psVar18,psVar12);
                  }
                  else {
                    ctrsv_("U","T","N",&nsupc,psVar12,&nsupr,psVar18,&incx);
                  }
                  lVar8 = lVar8 + 1;
                  fVar35 = local_180._0_4_;
                }
              }
            }
            else if (*(char *)&local_170->r == 'N') {
              if (cVar1 == 'L') {
                if (local_178->nrow == 0) {
                  return 0;
                }
                local_140 = lVar5 + 0xc;
                fVar33 = 0.0;
                fVar34 = 0.0;
                fStack_150 = 0.0;
                fStack_14c = 0.0;
                fVar35 = 0.0;
                pSVar16 = (SuperMatrix *)0x0;
                do {
                  local_158 = CONCAT44(fVar34,fVar33);
                  psVar18 = local_160;
                  pSVar17 = pSVar16;
                  while( true ) {
                    if ((long)*(int *)((long)pvVar4 + 4) < (long)pSVar17) goto LAB_0010d3b6;
                    lVar7 = *(long *)((long)pvVar4 + 0x20);
                    iVar19 = *(int *)(*(long *)((long)pvVar4 + 0x30) + (long)pSVar17 * 4);
                    lVar8 = (long)iVar19;
                    iVar2 = *(int *)(lVar7 + lVar8 * 4);
                    lVar13 = (long)iVar2;
                    nsupr = *(int *)(lVar7 + 4 + lVar8 * 4) - iVar2;
                    pSVar16 = (SuperMatrix *)((long)&pSVar17->Stype + 1);
                    nsupc = *(int *)(*(long *)((long)pvVar4 + 0x30) + 4 + (long)pSVar17 * 4) -
                            iVar19;
                    uVar21 = nsupr - nsupc;
                    iVar19 = *(int *)(*(long *)((long)pvVar4 + 0x10) + lVar8 * 4);
                    fVar35 = (float)(int)(nsupc * uVar21 * 8) +
                             fVar35 + (float)((nsupc * 4 + 6) * nsupc);
                    if (nsupc == 1) break;
                    local_180 = (SuperMatrix *)CONCAT44(local_180._4_4_,fVar35);
                    local_170 = x + lVar8;
                    local_178 = pSVar16;
                    clsolve(nsupr,nsupc,(singlecomplex *)((long)iVar19 * 8 + lVar5),local_170);
                    psVar18 = local_160;
                    cmatvec(nsupr,nsupr - nsupc,nsupc,
                            (singlecomplex *)((long)(iVar19 + nsupc) * 8 + lVar5),local_170,
                            local_160);
                    if ((int)uVar21 < 1) {
                      uVar21 = 0;
                    }
                    for (uVar10 = 0; uVar21 != uVar10; uVar10 = uVar10 + 1) {
                      iVar19 = *(int *)(*(long *)((long)pvVar4 + 0x18) + (long)(iVar2 + nsupc) * 4 +
                                       uVar10 * 4);
                      sVar23.r = x[iVar19].r - psVar18[uVar10].r;
                      sVar23.i = x[iVar19].i - psVar18[uVar10].i;
                      x[iVar19] = sVar23;
                      psVar18[uVar10].r = (float)local_158;
                      psVar18[uVar10].i = local_158._4_4_;
                    }
                    pSVar17 = local_178;
                    fVar33 = (float)local_158;
                    fVar34 = local_158._4_4_;
                    fVar35 = local_180._0_4_;
                  }
                  iVar2 = *(int *)(lVar7 + 4 + lVar8 * 4);
                  pfVar11 = (float *)(local_140 + (long)iVar19 * 8);
                  while (lVar13 = lVar13 + 1, lVar13 < iVar2) {
                    iVar19 = *(int *)(*(long *)((long)pvVar4 + 0x18) + lVar13 * 4);
                    fVar26 = pfVar11[-1];
                    fVar22 = x[lVar8].r;
                    fVar34 = x[lVar8].i;
                    fVar30 = *pfVar11;
                    fVar33 = fVar26 * fVar22 + -fVar34 * fVar30;
                    fVar34 = fVar26 * fVar34 + fVar22 * fVar30;
                    fStack_150 = fVar26 * 0.0 + fVar22 * fVar30;
                    fStack_14c = fVar26 * 0.0 + fVar22 * fVar30;
                    sVar24.r = x[iVar19].r - fVar33;
                    sVar24.i = x[iVar19].i - fVar34;
                    x[iVar19] = sVar24;
                    pfVar11 = pfVar11 + 2;
                  }
                } while( true );
              }
              if (local_180->nrow == 0) {
                return 0;
              }
              fVar35 = 0.0;
              uVar21 = *(uint *)((long)pvVar4 + 4);
              while (psVar18 = local_160, -1 < (int)uVar21) {
                local_178 = (SuperMatrix *)CONCAT44(local_178._4_4_,uVar21);
                uVar10 = (ulong)uVar21;
                iVar19 = *(int *)(*(long *)((long)pvVar4 + 0x30) + uVar10 * 4);
                lVar8 = (long)iVar19;
                nsupr = *(int *)(*(long *)((long)pvVar4 + 0x20) + 4 + lVar8 * 4) -
                        *(int *)(*(long *)((long)pvVar4 + 0x20) + lVar8 * 4);
                nsupc = *(int *)(*(long *)((long)pvVar4 + 0x30) + 4 + uVar10 * 4) - iVar19;
                local_180 = (SuperMatrix *)
                            CONCAT44(local_180._4_4_,fVar35 + (float)((nsupc * 4 + 0xe) * nsupc));
                psVar18 = x + lVar8;
                psVar12 = (singlecomplex *)
                          ((long)*(int *)(*(long *)((long)pvVar4 + 0x10) + lVar8 * 4) * 8 + lVar5);
                if (nsupc == 1) {
                  local_170 = psVar18;
                  c_div(psVar18,psVar18,psVar12);
                  iVar19 = *(int *)(*(long *)((long)pvVar6 + 0x18) + 4 + lVar8 * 4);
                  for (lVar8 = (long)*(int *)(*(long *)((long)pvVar6 + 0x18) + lVar8 * 4);
                      lVar8 < iVar19; lVar8 = lVar8 + 1) {
                    iVar2 = *(int *)(*(long *)((long)pvVar6 + 0x10) + lVar8 * 4);
                    fVar34 = (*local_170).r;
                    fVar26 = (*local_170).i;
                    fVar35 = *(float *)(lVar7 + lVar8 * 8);
                    fVar33 = *(float *)(lVar7 + 4 + lVar8 * 8);
                    sVar25.r = x[iVar2].r - (fVar35 * fVar34 + -fVar26 * fVar33);
                    sVar25.i = x[iVar2].i - (fVar35 * fVar26 + fVar34 * fVar33);
                    x[iVar2] = sVar25;
                  }
                  fVar35 = local_180._0_4_;
                }
                else {
                  local_170 = (singlecomplex *)(uVar10 + 1);
                  cusolve(nsupr,nsupc,psVar12,psVar18);
                  iVar19 = *(int *)(*(long *)((long)pvVar4 + 0x30) + (long)local_170 * 4);
                  fVar35 = local_180._0_4_;
                  while (lVar8 < iVar19) {
                    iVar2 = *(int *)(*(long *)((long)pvVar6 + 0x18) + 4 + lVar8 * 4);
                    iVar3 = *(int *)(*(long *)((long)pvVar6 + 0x18) + lVar8 * 4);
                    for (lVar13 = (long)iVar3; lVar13 < iVar2; lVar13 = lVar13 + 1) {
                      iVar15 = *(int *)(*(long *)((long)pvVar6 + 0x10) + lVar13 * 4);
                      fVar26 = x[lVar8].r;
                      fVar30 = x[lVar8].i;
                      fVar33 = *(float *)(lVar7 + lVar13 * 8);
                      fVar34 = *(float *)(lVar7 + 4 + lVar13 * 8);
                      sVar28.r = x[iVar15].r - (fVar33 * fVar26 + -fVar30 * fVar34);
                      sVar28.i = x[iVar15].i - (fVar33 * fVar30 + fVar26 * fVar34);
                      x[iVar15] = sVar28;
                    }
                    fVar35 = fVar35 + (float)((iVar2 - iVar3) * 8);
                    lVar8 = lVar8 + 1;
                  }
                }
                uVar21 = (int)local_178 - 1;
              }
            }
            else if (cVar1 == 'L') {
              if (local_178->nrow == 0) {
                return 0;
              }
              fVar35 = 0.0;
              uVar21 = *(uint *)((long)pvVar4 + 4);
              while (psVar18 = local_160, -1 < (int)uVar21) {
                lVar7 = *(long *)((long)pvVar4 + 0x30);
                local_178 = (SuperMatrix *)CONCAT44(local_178._4_4_,uVar21);
                uVar10 = (ulong)uVar21;
                iVar19 = *(int *)(lVar7 + uVar10 * 4);
                lVar13 = (long)iVar19;
                iVar2 = *(int *)(*(long *)((long)pvVar4 + 0x20) + lVar13 * 4);
                nsupr = *(int *)(*(long *)((long)pvVar4 + 0x20) + 4 + lVar13 * 4) - iVar2;
                nsupc = *(int *)(lVar7 + 4 + uVar10 * 4) - iVar19;
                lVar8 = *(long *)((long)pvVar4 + 0x10);
                iVar19 = *(int *)(lVar8 + lVar13 * 4);
                local_158 = (long)iVar19;
                iVar3 = *(int *)(lVar7 + 4 + uVar10 * 4);
                lVar7 = lVar13;
                while (lVar9 = lVar7, lVar9 < iVar3) {
                  iVar15 = iVar19 + nsupc;
                  iVar19 = *(int *)(lVar8 + 4 + lVar9 * 4);
                  lVar20 = (long)(iVar2 + nsupc);
                  for (lVar14 = (long)iVar15; lVar7 = lVar9 + 1, lVar14 < iVar19;
                      lVar14 = lVar14 + 1) {
                    temp.r = *(float *)(lVar5 + lVar14 * 8);
                    fVar33 = *(float *)(lVar5 + 4 + lVar14 * 8);
                    temp.i = -fVar33;
                    fVar34 = x[*(int *)(*(long *)((long)pvVar4 + 0x18) + lVar20 * 4)].r;
                    fVar26 = x[*(int *)(*(long *)((long)pvVar4 + 0x18) + lVar20 * 4)].i;
                    sVar31.r = x[lVar9].r - (temp.r * fVar34 + fVar26 * fVar33);
                    sVar31.i = x[lVar9].i - (temp.r * fVar26 + fVar34 * temp.i);
                    x[lVar9] = sVar31;
                    lVar20 = lVar20 + 1;
                  }
                }
                fVar35 = fVar35 + (float)((nsupr - nsupc) * nsupc * 8);
                if (1 < nsupc) {
                  local_180 = (SuperMatrix *)
                              CONCAT44(local_180._4_4_,fVar35 + (float)((nsupc + -1) * nsupc * 4));
                  ctrsv_("L",(char *)local_170,"U",&nsupc,(singlecomplex *)(lVar5 + local_158 * 8),
                         &nsupr,x + lVar13,&incx);
                  fVar35 = local_180._0_4_;
                }
                uVar21 = (int)local_178 - 1;
              }
            }
            else {
              if (local_180->nrow == 0) {
                return 0;
              }
              lVar8 = 0;
              fVar35 = 0.0;
              while (psVar18 = local_160, lVar8 <= *(int *)((long)pvVar4 + 4)) {
                lVar13 = *(long *)((long)pvVar4 + 0x30);
                iVar19 = *(int *)(lVar13 + lVar8 * 4);
                lVar9 = (long)iVar19;
                nsupr = *(int *)(*(long *)((long)pvVar4 + 0x20) + 4 + lVar9 * 4) -
                        *(int *)(*(long *)((long)pvVar4 + 0x20) + lVar9 * 4);
                nsupc = *(int *)(lVar13 + 4 + lVar8 * 4) - iVar19;
                iVar19 = *(int *)(*(long *)((long)pvVar4 + 0x10) + lVar9 * 4);
                iVar2 = *(int *)(lVar13 + 4 + lVar8 * 4);
                lVar13 = lVar9;
                while (lVar13 < iVar2) {
                  iVar3 = *(int *)(*(long *)((long)pvVar6 + 0x18) + 4 + lVar13 * 4);
                  iVar15 = *(int *)(*(long *)((long)pvVar6 + 0x18) + lVar13 * 4);
                  for (lVar20 = (long)iVar15; lVar20 < iVar3; lVar20 = lVar20 + 1) {
                    temp.r = *(float *)(lVar7 + lVar20 * 8);
                    fVar33 = *(float *)(lVar7 + 4 + lVar20 * 8);
                    temp.i = -fVar33;
                    fVar34 = x[*(int *)(*(long *)((long)pvVar6 + 0x10) + lVar20 * 4)].r;
                    fVar26 = x[*(int *)(*(long *)((long)pvVar6 + 0x10) + lVar20 * 4)].i;
                    sVar32.r = x[lVar13].r - (temp.r * fVar34 + fVar26 * fVar33);
                    sVar32.i = x[lVar13].i - (temp.r * fVar26 + fVar34 * temp.i);
                    x[lVar13] = sVar32;
                  }
                  fVar35 = fVar35 + (float)((iVar3 - iVar15) * 8);
                  lVar13 = lVar13 + 1;
                }
                local_180 = (SuperMatrix *)
                            CONCAT44(local_180._4_4_,fVar35 + (float)((nsupc * 4 + 0xe) * nsupc));
                psVar18 = (singlecomplex *)((long)iVar19 * 8 + lVar5);
                if (nsupc == 1) {
                  temp.r = psVar18->r;
                  temp.i = -psVar18->i;
                  c_div(x + lVar9,x + lVar9,&temp);
                }
                else {
                  ctrsv_("U",(char *)local_170,"N",&nsupc,psVar18,&nsupr,x + lVar9,&incx);
                }
                lVar8 = lVar8 + 1;
                fVar35 = local_180._0_4_;
              }
            }
LAB_0010d3b6:
            stat->ops[0x11] = fVar35 + stat->ops[0x11];
            superlu_free(psVar18);
            return 0;
          }
        }
      }
      else {
        fVar35 = 4.2039e-45;
        iVar19 = -3;
      }
    }
  }
  else {
    fVar35 = 1.4013e-45;
    iVar19 = -1;
  }
  *info = iVar19;
  temp.r = fVar35;
  input_error("sp_ctrsv",(int *)&temp);
  return 0;
}

Assistant:

int
sp_ctrsv(char *uplo, char *trans, char *diag, SuperMatrix *L, 
         SuperMatrix *U, singlecomplex *x, SuperLUStat_t *stat, int *info)
{
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    SCformat *Lstore;
    NCformat *Ustore;
    singlecomplex   *Lval, *Uval;
    int incx = 1, incy = 1;
    singlecomplex temp;
    singlecomplex alpha = {1.0, 0.0}, beta = {1.0, 0.0};
    singlecomplex comp_zero = {0.0, 0.0};
    int nrow, irow, jcol;
    int fsupc, nsupr, nsupc;
    int_t luptr, istart, i, k, iptr;
    singlecomplex *work;
    flops_t solve_ops;

    /* Test the input parameters */
    *info = 0;
    if ( strncmp(uplo,"L", 1)!=0 && strncmp(uplo, "U", 1)!=0 ) *info = -1;
    else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 && 
              strncmp(trans, "C", 1)!=0) *info = -2;
    else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 )
         *info = -3;
    else if ( L->nrow != L->ncol || L->nrow < 0 ) *info = -4;
    else if ( U->nrow != U->ncol || U->nrow < 0 ) *info = -5;
    if ( *info ) {
	int ii = -(*info);
	input_error("sp_ctrsv", &ii);
	return 0;
    }

    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;

    if ( !(work = singlecomplexCalloc(L->nrow)) )
	ABORT("Malloc fails for work in sp_ctrsv().");
    
    if ( strncmp(trans, "N", 1)==0 ) {	/* Form x := inv(A)*x. */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L)*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
		fsupc = L_FST_SUPC(k);
		istart = L_SUB_START(fsupc);
		nsupr = L_SUB_START(fsupc+1) - istart;
		nsupc = L_FST_SUPC(k+1) - fsupc;
		luptr = L_NZ_START(fsupc);
		nrow = nsupr - nsupc;

                /* 1 c_div costs 10 flops */
	        solve_ops += 4 * nsupc * (nsupc - 1) + 10 * nsupc;
	        solve_ops += 8 * nrow * nsupc;

		if ( nsupc == 1 ) {
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); ++iptr) {
			irow = L_SUB(iptr);
			++luptr;
			cc_mult(&comp_zero, &x[fsupc], &Lval[luptr]);
			c_sub(&x[irow], &x[irow], &comp_zero);
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    CGEMV(ftcs2, &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#else
		    ctrsv_("L", "N", "U", &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    cgemv_("N", &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#endif
#else
		    clsolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc]);
		
		    cmatvec ( nsupr, nsupr-nsupc, nsupc, &Lval[luptr+nsupc],
                             &x[fsupc], &work[0] );
#endif		
		
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; ++i, ++iptr) {
			irow = L_SUB(iptr);
			c_sub(&x[irow], &x[irow], &work[i]); /* Scatter */
			work[i] = comp_zero;

		    }
	 	}
	    } /* for k ... */
	    
	} else {
	    /* Form x := inv(U)*x */
	    
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; k--) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);
		
                /* 1 c_div costs 10 flops */
    	        solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;

		if ( nsupc == 1 ) {
		    c_div(&x[fsupc], &x[fsupc], &Lval[luptr]);
		    for (i = U_NZ_START(fsupc); i < U_NZ_START(fsupc+1); ++i) {
			irow = U_SUB(i);
			cc_mult(&comp_zero, &x[fsupc], &Uval[i]);
			c_sub(&x[irow], &x[irow], &comp_zero);
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV(ftcs3, ftcs2, ftcs2, &nsupc, &Lval[luptr], &nsupr,
		       &x[fsupc], &incx);
#else
		    ctrsv_("U", "N", "N", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
#else		
		    cusolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc] );
#endif		

		    for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		        solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    	for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); 
				i++) {
			    irow = U_SUB(i);
			cc_mult(&comp_zero, &x[jcol], &Uval[i]);
			c_sub(&x[irow], &x[irow], &comp_zero);
		    	}
                    }
		}
	    } /* for k ... */
	    
	}
    } else if ( strncmp(trans, "T", 1)==0 ) { /* Form x := inv(A')*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L')*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 8 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
			cc_mult(&comp_zero, &x[irow], &Lval[i]);
		    	c_sub(&x[jcol], &x[jcol], &comp_zero);
			iptr++;
		    }
		}
		
		if ( nsupc > 1 ) {
		    solve_ops += 4 * nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    CTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
		    ctrsv_("L", "T", "U", &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := inv(U')*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
			cc_mult(&comp_zero, &x[irow], &Uval[i]);
		    	c_sub(&x[jcol], &x[jcol], &comp_zero);
		    }
		}

                /* 1 c_div costs 10 flops */
		solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;

		if ( nsupc == 1 ) {
		    c_div(&x[fsupc], &x[fsupc], &Lval[luptr]);
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
		    ctrsv_("U", "T", "N", &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#endif
		}
	    } /* for k ... */
	}
    } else { /* Form x := conj(inv(A'))*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := conj(inv(L'))*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 8 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
                        cc_conj(&temp, &Lval[i]);
			cc_mult(&comp_zero, &x[irow], &temp);
		    	c_sub(&x[jcol], &x[jcol], &comp_zero);
			iptr++;
		    }
 		}
 		
 		if ( nsupc > 1 ) {
		    solve_ops += 4 * nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd(trans, strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    CTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
                    ctrsv_("L", trans, "U", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := conj(inv(U'))*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
                        cc_conj(&temp, &Uval[i]);
			cc_mult(&comp_zero, &x[irow], &temp);
		    	c_sub(&x[jcol], &x[jcol], &comp_zero);
		    }
		}

                /* 1 c_div costs 10 flops */
		solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;
 
		if ( nsupc == 1 ) {
                    cc_conj(&temp, &Lval[luptr]);
		    c_div(&x[fsupc], &x[fsupc], &temp);
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd(trans, strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
                    ctrsv_("U", trans, "N", &nsupc, &Lval[luptr], &nsupr,
                               &x[fsupc], &incx);
#endif
  		}
  	    } /* for k ... */
  	}
    }

    stat->ops[SOLVE] += solve_ops;
    SUPERLU_FREE(work);
    return 0;
}